

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<24U,_unsigned_char,_void,_false> * __thiscall
math::wide_integer::uintwide_t<48U,_unsigned_short,_void,_false>::mul_by_limb
          (uintwide_t<48U,_unsigned_short,_void,_false> *this,limb_type_conflict v)

{
  long lVar1;
  int iVar2;
  undefined6 in_register_00000032;
  
  iVar2 = (int)CONCAT62(in_register_00000032,v);
  if (iVar2 != 1) {
    if (iVar2 == 0) {
      for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 2) {
        *(undefined2 *)(this + lVar1) = 0;
      }
    }
    else {
      uintwide_t<48u,unsigned_short,void,false>::
      eval_multiply_1d<unsigned_short*,unsigned_short_const*>
                ((unsigned_short *)this,(unsigned_short *)this,v,3);
    }
  }
  return (uintwide_t<24U,_unsigned_char,_void,_false> *)this;
}

Assistant:

constexpr auto mul_by_limb(const limb_type v) -> uintwide_t&
    {
      if(v == static_cast<limb_type>(UINT8_C(0)))
      {
        detail::fill_unsafe(values.begin(), values.end(), static_cast<typename representation_type::value_type>(UINT8_C(0)));
      }
      else if(v > static_cast<limb_type>(UINT8_C(1)))
      {
        static_cast<void>(eval_multiply_1d(values.begin(),
                                           values.cbegin(),
                                           v,
                                           number_of_limbs));
      }

      return *this;
    }